

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3BtreeTripAllCursors(Btree *pBtree,int errCode,int writeOnly)

{
  int in_EDX;
  undefined4 in_ESI;
  long in_RDI;
  int rc;
  BtCursor *p;
  BtCursor *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar1;
  char *pcVar2;
  
  iVar1 = 0;
  if (in_RDI != 0) {
    sqlite3BtreeEnter((Btree *)0x16f3ae);
    for (pcVar2 = *(char **)(*(long *)(in_RDI + 8) + 0x10); pcVar2 != (char *)0x0;
        pcVar2 = *(char **)(pcVar2 + 0x28)) {
      if ((in_EDX == 0) || ((pcVar2[1] & 1U) != 0)) {
        sqlite3BtreeClearCursor((BtCursor *)0x16f433);
        *pcVar2 = '\x04';
        *(undefined4 *)(pcVar2 + 4) = in_ESI;
      }
      else if (((*pcVar2 == '\0') || (*pcVar2 == '\x02')) &&
              (iVar1 = saveCursorPosition(in_stack_ffffffffffffffd8), iVar1 != 0)) {
        sqlite3BtreeTripAllCursors
                  ((Btree *)CONCAT44(in_ESI,in_EDX),(int)((ulong)pcVar2 >> 0x20),(int)pcVar2);
        break;
      }
      btreeReleaseAllCursorPages((BtCursor *)CONCAT44(iVar1,in_stack_ffffffffffffffe0));
    }
    sqlite3BtreeLeave((Btree *)0x16f46e);
  }
  return iVar1;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeTripAllCursors(Btree *pBtree, int errCode, int writeOnly){
  BtCursor *p;
  int rc = SQLITE_OK;

  assert( (writeOnly==0 || writeOnly==1) && BTCF_WriteFlag==1 );
  if( pBtree ){
    sqlite3BtreeEnter(pBtree);
    for(p=pBtree->pBt->pCursor; p; p=p->pNext){
      if( writeOnly && (p->curFlags & BTCF_WriteFlag)==0 ){
        if( p->eState==CURSOR_VALID || p->eState==CURSOR_SKIPNEXT ){
          rc = saveCursorPosition(p);
          if( rc!=SQLITE_OK ){
            (void)sqlite3BtreeTripAllCursors(pBtree, rc, 0);
            break;
          }
        }
      }else{
        sqlite3BtreeClearCursor(p);
        p->eState = CURSOR_FAULT;
        p->skipNext = errCode;
      }
      btreeReleaseAllCursorPages(p);
    }
    sqlite3BtreeLeave(pBtree);
  }
  return rc;
}